

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O0

void __thiscall
LineSplitter_TwoStringsInTwoParts_Test::~LineSplitter_TwoStringsInTwoParts_Test
          (LineSplitter_TwoStringsInTwoParts_Test *this)

{
  LineSplitter_TwoStringsInTwoParts_Test *this_local;
  
  ~LineSplitter_TwoStringsInTwoParts_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (LineSplitter, TwoStringsInTwoParts) {
    using namespace pstore::dump;

    array::container container;
    line_splitter ls (&container);
    ls.append ("hello\nth"s);
    ls.append ("ere\n"s);

    array arr (std::move (container));
    std::ostringstream out;
    arr.write (out);
    EXPECT_EQ (out.str (), "\n- hello\n- there");
}